

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * units::generateUnitSequence(string *__return_storage_ptr__,double mux,string *seq)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool numOnly;
  bool numOnly_00;
  bool numOnly_01;
  bool numOnly_02;
  bool numOnly_03;
  bool numOnly_04;
  bool numOnly_05;
  bool numOnly_06;
  undefined1 extraout_DL;
  undefined1 uVar6;
  bool numOnly_07;
  bool numOnly_08;
  bool numOnly_09;
  bool numOnly_10;
  undefined1 extraout_DL_00;
  bool numOnly_11;
  undefined1 extraout_DL_01;
  bool numOnly_12;
  byte bVar7;
  double dVar8;
  char *pcStack_80;
  string muxstr;
  string local_48;
  
  iVar3 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x3);
  if (iVar3 == 0) {
    if (0.1 < mux) {
LAB_00153b22:
      bVar7 = 0;
    }
    else {
      pcStack_80 = (char *)0x3;
LAB_00153ae9:
      bVar7 = 0;
      std::__cxx11::string::replace((ulong)seq,0,pcStack_80);
      mux = mux * 1000.0;
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x4);
    if (iVar3 == 0) {
      if (mux <= 100.0) goto LAB_00153b22;
      pcStack_80 = (char *)0x4;
LAB_00153b46:
      bVar7 = 0;
      std::__cxx11::string::replace((ulong)seq,0,pcStack_80);
      mux = mux / 1000.0;
    }
    else {
      iVar3 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x5);
      if (iVar3 == 0) {
        bVar7 = 1;
        if (100.0 < mux) {
          pcStack_80 = (char *)0x5;
          goto LAB_00153b46;
        }
      }
      else {
        bVar7 = 0;
        iVar3 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x2);
        if (((iVar3 == 0) && (bVar7 = 1, mux <= 0.1)) &&
           ((seq->_M_string_length < 4 || ((seq->_M_dataplus)._M_p[2] != '^')))) {
          pcStack_80 = (char *)0x2;
          goto LAB_00153ae9;
        }
      }
    }
  }
  pcVar2 = (seq->_M_dataplus)._M_p;
  cVar1 = *pcVar2;
  if ((mux == 1.0) && (!NAN(mux))) {
    if (cVar1 == '/') {
      std::__cxx11::string::insert(seq,pcVar2,0x31);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)seq);
    return __return_storage_ptr__;
  }
  uVar4 = std::__cxx11::string::find((char)seq,0x5e);
  if (cVar1 == '/') {
    if (uVar4 == 0xffffffffffffffff) {
LAB_00153cae:
      muxstr._M_dataplus._M_p = (pointer)&muxstr.field_2;
      muxstr.field_2._M_local_buf[0] = '\0';
      muxstr._M_string_length = 0;
      getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,1.0 / mux,numOnly);
      std::__cxx11::string::operator=((string *)&muxstr,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      bVar7 = *muxstr._M_dataplus._M_p;
      if (((byte)(bVar7 - 0x30) < 10) ||
         ((bVar7 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) != 0)))) {
        getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_01);
        goto LAB_00153f56;
      }
LAB_00153f85:
      std::__cxx11::string::insert((ulong)seq,(string *)0x1);
      std::__cxx11::string::assign((char *)&muxstr);
    }
    else {
      cVar1 = (seq->_M_dataplus)._M_p[uVar4 + 1];
      muxstr._M_dataplus._M_p = (pointer)&muxstr.field_2;
      muxstr._M_string_length = 0;
      muxstr.field_2._M_local_buf[0] = '\0';
      if (cVar1 == '3') {
        dVar8 = cbrt(1.0 / mux);
        getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,dVar8,numOnly_05);
        std::__cxx11::string::operator=((string *)&muxstr,(string *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        bVar7 = *muxstr._M_dataplus._M_p;
        if ((9 < (byte)(bVar7 - 0x30)) &&
           ((0x2e < bVar7 || ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0))))
        goto LAB_00153f85;
        getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_06);
      }
      else if (cVar1 == '2') {
        dVar8 = 1.0 / mux;
        if (dVar8 < 0.0) {
          dVar8 = sqrt(dVar8);
          uVar6 = extraout_DL;
        }
        else {
          dVar8 = SQRT(dVar8);
          uVar6 = numOnly;
        }
        getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,dVar8,(bool)uVar6);
        std::__cxx11::string::operator=((string *)&muxstr,(string *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        bVar7 = *muxstr._M_dataplus._M_p;
        if ((9 < (byte)(bVar7 - 0x30)) &&
           ((0x2e < bVar7 || ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0))))
        goto LAB_00153f85;
        getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_07);
      }
      else {
        if (cVar1 == '1') goto LAB_00153cae;
        getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly);
      }
LAB_00153f56:
      std::__cxx11::string::operator=((string *)&muxstr,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::operator+(__return_storage_ptr__,&muxstr,seq);
    goto LAB_001541ff;
  }
  if (uVar4 == 0xffffffffffffffff) {
    getMultiplierString_abi_cxx11_(&muxstr,(units *)(ulong)bVar7,mux,numOnly);
    std::operator+(__return_storage_ptr__,&muxstr,seq);
    goto LAB_001541ff;
  }
  uVar5 = std::__cxx11::string::find_first_of((char *)seq,0x16aa47);
  if (uVar5 < uVar4) {
    getMultiplierString_abi_cxx11_(&muxstr,(units *)(ulong)bVar7,mux,numOnly_00);
    std::operator+(__return_storage_ptr__,&muxstr,seq);
    goto LAB_001541ff;
  }
  std::__cxx11::string::substr((ulong)&muxstr,(ulong)seq);
  iVar3 = std::__cxx11::stoi(&muxstr,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&muxstr);
  muxstr._M_dataplus._M_p = (pointer)&muxstr.field_2;
  muxstr._M_string_length = 0;
  muxstr.field_2._M_local_buf[0] = '\0';
  switch(iVar3) {
  default:
    getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_02);
    break;
  case 2:
    if (mux < 0.0) {
      dVar8 = sqrt(mux);
      uVar6 = extraout_DL_01;
    }
    else {
      dVar8 = SQRT(mux);
      uVar6 = numOnly_02;
    }
    getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,dVar8,(bool)uVar6);
    std::__cxx11::string::operator=((string *)&muxstr,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    bVar7 = *muxstr._M_dataplus._M_p;
    if ((9 < (byte)(bVar7 - 0x30)) &&
       ((0x2e < bVar7 || ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0))))
    goto LAB_001541ef;
    getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_12);
    break;
  case 3:
    dVar8 = cbrt(mux);
    getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,dVar8,numOnly_09);
    std::__cxx11::string::operator=((string *)&muxstr,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    bVar7 = *muxstr._M_dataplus._M_p;
    if ((9 < (byte)(bVar7 - 0x30)) &&
       ((0x2e < bVar7 || ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0))))
    goto LAB_001541ef;
    getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_10);
    break;
  case -3:
    dVar8 = cbrt(1.0 / mux);
    getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,dVar8,numOnly_03);
    std::__cxx11::string::operator=((string *)&muxstr,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    bVar7 = *muxstr._M_dataplus._M_p;
    if (((byte)(bVar7 - 0x30) < 10) ||
       ((bVar7 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) != 0)))) {
      getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_04);
      break;
    }
    goto LAB_001541ef;
  case -2:
    dVar8 = 1.0 / mux;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
      uVar6 = extraout_DL_00;
    }
    else {
      dVar8 = SQRT(dVar8);
      uVar6 = numOnly_02;
    }
    getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,dVar8,(bool)uVar6);
    std::__cxx11::string::operator=((string *)&muxstr,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    bVar7 = *muxstr._M_dataplus._M_p;
    if ((9 < (byte)(bVar7 - 0x30)) &&
       ((0x2e < bVar7 || ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0))))
    goto LAB_001541ef;
    getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_11);
    break;
  case -1:
    getMultiplierString_abi_cxx11_(&local_48,(units *)(ulong)bVar7,1.0 / mux,numOnly_02);
    std::__cxx11::string::operator=((string *)&muxstr,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    bVar7 = *muxstr._M_dataplus._M_p;
    if ((9 < (byte)(bVar7 - 0x30)) &&
       ((0x2e < bVar7 || ((0x680000000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0))))
    goto LAB_001541ef;
    getMultiplierString_abi_cxx11_(&local_48,(units *)0x1,mux,numOnly_08);
  }
  std::__cxx11::string::operator=((string *)&muxstr,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
LAB_001541ef:
  std::operator+(__return_storage_ptr__,&muxstr,seq);
LAB_001541ff:
  std::__cxx11::string::~string((string *)&muxstr);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateUnitSequence(double mux, std::string seq)
{
    bool noPrefix = false;
    // deal with a few common things
    if (seq.compare(0, 3, "m^3") == 0) {
        if (mux <= 0.1) {
            seq.replace(0, 3, "L");
            mux *= 1000.0;
        }
    } else if (seq.compare(0, 4, "m^-3") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 4, "L^-1");
            mux /= 1000.0;
        }
    } else if (seq.compare(0, 5, "kg^-1") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 5, "g^-1");
            mux /= 1000.0;
        } else {
            noPrefix = true;
        }
    } else if (seq.compare(0, 2, "kg") == 0) {
        if (mux <= 0.1) {
            if (seq.size() > 3 && seq[2] == '^') {
                noPrefix = true;
            } else {
                seq.replace(0, 2, "g");
                mux *= 1000.0;
            }
        } else {
            noPrefix = true;
        }
    }
    if (mux == 1.0) {
        if (seq.front() == '/') {
            seq.insert(seq.begin(), '1');
        }
        return seq;
    }
    if (seq.front() == '/') {
        int pw = 1;
        auto pwerloc = seq.find_first_of('^');
        if (pwerloc != std::string::npos) {
#ifdef UNITS_CONSTEXPR_IF_SUPPORTED
            if constexpr (
                detail::bitwidth::base_size == sizeof(std::uint32_t)) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                if (seq.size() <= pwerloc + 2 ||
                    !isDigitCharacter(seq[pwerloc + 2])) {
                    pw = seq[pwerloc + 1] - '0';
                } else {
                    pw = 10;
                }
            }
#else
            if (detail::bitwidth::base_size == sizeof(std::uint32_t) ||
                seq.size() <= pwerloc + 2 ||
                !isDigitCharacter(seq[pwerloc + 2])) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                pw = 10;
            }
#endif
        }
        std::string muxstr;
        switch (pw) {
            case 1:
                muxstr = getMultiplierString(1.0 / mux, noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 2:
                muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 3:
                muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            default:
                muxstr = getMultiplierString(mux, true);
        }
        return muxstr + seq;
    }
    auto pwerloc = seq.find_first_of('^');
    if (pwerloc == std::string::npos) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    auto mloc = seq.find_first_of("*/)");
    if (mloc < pwerloc) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    int offset = (seq[pwerloc + 1] != '(') ? 1 : 2;
    int pw = stoi(seq.substr(pwerloc + offset, mloc - pwerloc - offset + 1));
    std::string muxstr;
    switch (pw) {
        case -1:
            muxstr = getMultiplierString(1.0 / mux, noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -2:
            muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -3:
            muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 2:
            muxstr = getMultiplierString(std::sqrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 3:
            muxstr = getMultiplierString(std::cbrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        default:
            muxstr = getMultiplierString(mux, true);
    }
    return muxstr + seq;
}